

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

int htmlCurrentChar(xmlParserCtxtPtr ctxt,int *len)

{
  byte bVar1;
  int iVar2;
  xmlChar *str1;
  xmlChar local_d8 [8];
  char buffer [150];
  xmlCharEncodingHandlerPtr handler;
  xmlChar *guess;
  uint val;
  uchar c;
  uchar *cur;
  int *len_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (ctxt->instate == XML_PARSER_EOF) {
    return 0;
  }
  if (ctxt->token != 0) {
    *len = 0;
    return ctxt->token;
  }
  if (ctxt->charset != 1) {
    if (*ctxt->input->cur < 0x80) {
      *len = 1;
      if ((*ctxt->input->cur == '\0') && (ctxt->input->cur < ctxt->input->end)) {
        htmlParseErrInt(ctxt,XML_ERR_INVALID_CHAR,"Char 0x%X out of allowed range\n",0);
        return 0x20;
      }
      return (uint)*ctxt->input->cur;
    }
    str1 = htmlFindEncoding(ctxt);
    if (str1 == (xmlChar *)0x0) {
      xmlSwitchEncoding(ctxt,XML_CHAR_ENCODING_8859_1);
    }
    else {
      if (ctxt->input->encoding != (xmlChar *)0x0) {
        (*xmlFree)(ctxt->input->encoding);
      }
      ctxt->input->encoding = str1;
      register0x00000000 = xmlFindCharEncodingHandler((char *)str1);
      if (register0x00000000 == (xmlCharEncodingHandlerPtr)0x0) {
        htmlParseErr(ctxt,XML_ERR_INVALID_ENCODING,"Unsupported encoding %s",str1,(xmlChar *)0x0);
      }
      else {
        iVar2 = xmlStrEqual((xmlChar *)register0x00000000->name,"UTF-8");
        if (iVar2 == 0) {
          xmlSwitchToEncoding(ctxt,stack0xffffffffffffffc0);
        }
      }
    }
    ctxt->charset = 1;
  }
  _val = ctxt->input->cur;
  bVar1 = *_val;
  if ((bVar1 & 0x80) == 0) {
    if ((*ctxt->input->cur == '\0') && (ctxt->input->cur < ctxt->input->end)) {
      htmlParseErrInt(ctxt,XML_ERR_INVALID_CHAR,"Char 0x%X out of allowed range\n",0);
      *len = 1;
      return 0x20;
    }
    *len = 1;
    return (uint)*ctxt->input->cur;
  }
  if ((bVar1 & 0x40) != 0) {
    if (_val[1] == 0) {
      xmlParserInputGrow(ctxt->input,0xfa);
      _val = ctxt->input->cur;
    }
    if ((_val[1] & 0xc0) == 0x80) {
      if ((bVar1 & 0xe0) == 0xe0) {
        if (_val[2] == 0) {
          xmlParserInputGrow(ctxt->input,0xfa);
          _val = ctxt->input->cur;
        }
        if ((_val[2] & 0xc0) == 0x80) {
          if ((bVar1 & 0xf0) == 0xf0) {
            if (_val[3] == 0) {
              xmlParserInputGrow(ctxt->input,0xfa);
              _val = ctxt->input->cur;
            }
            if (((bVar1 & 0xf8) == 0xf0) && ((_val[3] & 0xc0) == 0x80)) {
              *len = 4;
              guess._0_4_ = _val[3] & 0x3f |
                            (_val[2] & 0x3f) << 6 | (_val[1] & 0x3f) << 0xc | (*_val & 7) << 0x12;
              if (0xffff < (uint)guess) goto LAB_00160b20;
            }
          }
          else {
            *len = 3;
            guess._0_4_ = _val[2] & 0x3f | (_val[1] & 0x3f) << 6 | (*_val & 0xf) << 0xc;
            if (0x7ff < (uint)guess) {
LAB_00160b20:
              if ((uint)guess < 0x100) {
                if ((8 < (uint)guess) && ((uint)guess < 0xb)) {
                  return (uint)guess;
                }
                if ((uint)guess == 0xd) {
                  return 0xd;
                }
                if (0x1f < (uint)guess) {
                  return (uint)guess;
                }
              }
              else {
                if ((0xff < (uint)guess) && ((uint)guess < 0xd800)) {
                  return (uint)guess;
                }
                if ((0xdfff < (uint)guess) && ((uint)guess < 0xfffe)) {
                  return (uint)guess;
                }
                if ((0xffff < (uint)guess) && ((uint)guess < 0x110000)) {
                  return (uint)guess;
                }
              }
              htmlParseErrInt(ctxt,XML_ERR_INVALID_CHAR,"Char 0x%X out of allowed range\n",
                              (uint)guess);
              return (uint)guess;
            }
          }
        }
      }
      else {
        *len = 2;
        guess._0_4_ = _val[1] & 0x3f | (*_val & 0x1f) << 6;
        if (0x7f < (uint)guess) goto LAB_00160b20;
      }
    }
  }
  if ((long)ctxt->input->end - (long)ctxt->input->cur < 4) {
    snprintf((char *)local_d8,0x95,"Bytes: 0x%02X\n",(ulong)*ctxt->input->cur);
  }
  else {
    snprintf((char *)local_d8,0x95,"Bytes: 0x%02X 0x%02X 0x%02X 0x%02X\n",(ulong)*ctxt->input->cur,
             (ulong)ctxt->input->cur[1],(ulong)ctxt->input->cur[2],(uint)ctxt->input->cur[3]);
  }
  htmlParseErr(ctxt,XML_ERR_INVALID_ENCODING,"Input is not proper UTF-8, indicate encoding !\n",
               local_d8,(xmlChar *)0x0);
  if ((ctxt->input->buf != (xmlParserInputBufferPtr)0x0) &&
     (ctxt->input->buf->encoder == (xmlCharEncodingHandlerPtr)0x0)) {
    xmlSwitchEncoding(ctxt,XML_CHAR_ENCODING_8859_1);
  }
  *len = 1;
  return (uint)*ctxt->input->cur;
}

Assistant:

static int
htmlCurrentChar(xmlParserCtxtPtr ctxt, int *len) {
    const unsigned char *cur;
    unsigned char c;
    unsigned int val;

    if (ctxt->instate == XML_PARSER_EOF)
	return(0);

    if (ctxt->token != 0) {
	*len = 0;
	return(ctxt->token);
    }
    if (ctxt->charset != XML_CHAR_ENCODING_UTF8) {
        xmlChar * guess;
        xmlCharEncodingHandlerPtr handler;

        /*
         * Assume it's a fixed length encoding (1) with
         * a compatible encoding for the ASCII set, since
         * HTML constructs only use < 128 chars
         */
        if (*ctxt->input->cur < 0x80) {
            *len = 1;
            if ((*ctxt->input->cur == 0) &&
                (ctxt->input->cur < ctxt->input->end)) {
                htmlParseErrInt(ctxt, XML_ERR_INVALID_CHAR,
                                "Char 0x%X out of allowed range\n", 0);
                return(' ');
            }
            return(*ctxt->input->cur);
        }

        /*
         * Humm this is bad, do an automatic flow conversion
         */
        guess = htmlFindEncoding(ctxt);
        if (guess == NULL) {
            xmlSwitchEncoding(ctxt, XML_CHAR_ENCODING_8859_1);
        } else {
            if (ctxt->input->encoding != NULL)
                xmlFree((xmlChar *) ctxt->input->encoding);
            ctxt->input->encoding = guess;
            handler = xmlFindCharEncodingHandler((const char *) guess);
            if (handler != NULL) {
                /*
                 * Don't use UTF-8 encoder which isn't required and
                 * can produce invalid UTF-8.
                 */
                if (!xmlStrEqual(BAD_CAST handler->name, BAD_CAST "UTF-8"))
                    xmlSwitchToEncoding(ctxt, handler);
            } else {
                htmlParseErr(ctxt, XML_ERR_INVALID_ENCODING,
                             "Unsupported encoding %s", guess, NULL);
            }
        }
        ctxt->charset = XML_CHAR_ENCODING_UTF8;
    }

    /*
     * We are supposed to handle UTF8, check it's valid
     * From rfc2044: encoding of the Unicode values on UTF-8:
     *
     * UCS-4 range (hex.)           UTF-8 octet sequence (binary)
     * 0000 0000-0000 007F   0xxxxxxx
     * 0000 0080-0000 07FF   110xxxxx 10xxxxxx
     * 0000 0800-0000 FFFF   1110xxxx 10xxxxxx 10xxxxxx
     *
     * Check for the 0x110000 limit too
     */
    cur = ctxt->input->cur;
    c = *cur;
    if (c & 0x80) {
        if ((c & 0x40) == 0)
            goto encoding_error;
        if (cur[1] == 0) {
            xmlParserInputGrow(ctxt->input, INPUT_CHUNK);
            cur = ctxt->input->cur;
        }
        if ((cur[1] & 0xc0) != 0x80)
            goto encoding_error;
        if ((c & 0xe0) == 0xe0) {

            if (cur[2] == 0) {
                xmlParserInputGrow(ctxt->input, INPUT_CHUNK);
                cur = ctxt->input->cur;
            }
            if ((cur[2] & 0xc0) != 0x80)
                goto encoding_error;
            if ((c & 0xf0) == 0xf0) {
                if (cur[3] == 0) {
                    xmlParserInputGrow(ctxt->input, INPUT_CHUNK);
                    cur = ctxt->input->cur;
                }
                if (((c & 0xf8) != 0xf0) ||
                    ((cur[3] & 0xc0) != 0x80))
                    goto encoding_error;
                /* 4-byte code */
                *len = 4;
                val = (cur[0] & 0x7) << 18;
                val |= (cur[1] & 0x3f) << 12;
                val |= (cur[2] & 0x3f) << 6;
                val |= cur[3] & 0x3f;
                if (val < 0x10000)
                    goto encoding_error;
            } else {
              /* 3-byte code */
                *len = 3;
                val = (cur[0] & 0xf) << 12;
                val |= (cur[1] & 0x3f) << 6;
                val |= cur[2] & 0x3f;
                if (val < 0x800)
                    goto encoding_error;
            }
        } else {
          /* 2-byte code */
            *len = 2;
            val = (cur[0] & 0x1f) << 6;
            val |= cur[1] & 0x3f;
            if (val < 0x80)
                goto encoding_error;
        }
        if (!IS_CHAR(val)) {
            htmlParseErrInt(ctxt, XML_ERR_INVALID_CHAR,
                            "Char 0x%X out of allowed range\n", val);
        }
        return(val);
    } else {
        if ((*ctxt->input->cur == 0) &&
            (ctxt->input->cur < ctxt->input->end)) {
            htmlParseErrInt(ctxt, XML_ERR_INVALID_CHAR,
                            "Char 0x%X out of allowed range\n", 0);
            *len = 1;
            return(' ');
        }
        /* 1-byte code */
        *len = 1;
        return(*ctxt->input->cur);
    }

encoding_error:
    /*
     * If we detect an UTF8 error that probably mean that the
     * input encoding didn't get properly advertised in the
     * declaration header. Report the error and switch the encoding
     * to ISO-Latin-1 (if you don't like this policy, just declare the
     * encoding !)
     */
    {
        char buffer[150];

	if (ctxt->input->end - ctxt->input->cur >= 4) {
	    snprintf(buffer, 149, "Bytes: 0x%02X 0x%02X 0x%02X 0x%02X\n",
			    ctxt->input->cur[0], ctxt->input->cur[1],
			    ctxt->input->cur[2], ctxt->input->cur[3]);
	} else {
	    snprintf(buffer, 149, "Bytes: 0x%02X\n", ctxt->input->cur[0]);
	}
	htmlParseErr(ctxt, XML_ERR_INVALID_ENCODING,
		     "Input is not proper UTF-8, indicate encoding !\n",
		     BAD_CAST buffer, NULL);
    }

    /*
     * Don't switch encodings twice. Note that if there's an encoder, we
     * shouldn't receive invalid UTF-8 anyway.
     *
     * Note that if ctxt->input->buf == NULL, switching encodings is
     * impossible, see Gitlab issue #34.
     */
    if ((ctxt->input->buf != NULL) &&
        (ctxt->input->buf->encoder == NULL))
        xmlSwitchEncoding(ctxt, XML_CHAR_ENCODING_8859_1);
    *len = 1;
    return(*ctxt->input->cur);
}